

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O2

SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker,SW_FT_Int side)

{
  SW_FT_Angle SVar1;
  long lVar2;
  SW_FT_Fixed SVar3;
  SW_FT_Long SVar4;
  SW_FT_Long SVar5;
  ulong uVar6;
  long lVar7;
  long b;
  long lVar8;
  SW_FT_Vector local_b8;
  SW_FT_StrokeBorder local_a0;
  SW_FT_Fixed local_98;
  ulong local_90;
  long local_88;
  SW_FT_Stroker local_80;
  SW_FT_Vector local_78;
  long local_68;
  long lStack_60;
  SW_FT_Vector local_58;
  SW_FT_Vector local_48;
  
  local_98 = stroker->radius;
  uVar6 = (ulong)(uint)side;
  SVar1 = SW_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  lVar8 = uVar6 * 0x1680000 + -0xb40000;
  if (SVar1 != 0xb40000) {
    lVar8 = SVar1;
  }
  local_a0 = stroker->borders + uVar6;
  lVar2 = -lVar8;
  if (0 < lVar8) {
    lVar2 = lVar8;
  }
  if (lVar2 < 0x5a0001) {
    lVar2 = 0x5a0000;
  }
  lVar7 = uVar6 * -0xb40000 + stroker->angle_in + 0x5a0000;
  uVar6 = (lVar2 - 1U) / 0x5a0000 + 1;
  SVar3 = SW_FT_Tan(lVar8 / (long)(ulong)(uint)((int)uVar6 * 4));
  b = SVar3 / 3 + SVar3;
  local_88 = lVar7;
  SW_FT_Vector_From_Polar(&local_48,local_98,lVar7);
  SVar4 = SW_FT_MulFix(-local_48.y,b);
  SVar5 = SW_FT_MulFix(local_48.x,b);
  local_48.x = (stroker->center).x + local_48.x;
  local_48.y = (stroker->center).y + local_48.y;
  local_78.x = SVar4 + local_48.x;
  local_78.y = SVar5 + local_48.y;
  lVar2 = lVar8;
  local_90 = uVar6;
  local_80 = stroker;
  for (lVar7 = -(uVar6 & 0xffffffff); lVar7 != 0; lVar7 = lVar7 + 1) {
    SW_FT_Vector_From_Polar(&local_b8,local_98,lVar2 / (long)local_90 + local_88);
    SVar4 = SW_FT_MulFix(local_b8.y,b);
    SVar5 = SW_FT_MulFix(-local_b8.x,b);
    local_b8.x = (local_80->center).x + local_b8.x;
    local_b8.y = (local_80->center).y + local_b8.y;
    local_68 = SVar4 + local_b8.x;
    lStack_60 = SVar5 + local_b8.y;
    local_58.x = local_68;
    local_58.y = lStack_60;
    ft_stroke_border_cubicto(local_a0,&local_78,&local_58,&local_b8);
    local_78.x = local_b8.x * 2 - local_68;
    local_78.y = local_b8.y * 2 - lStack_60;
    lVar2 = lVar2 + lVar8;
  }
  local_a0->movable = '\0';
  return (SW_FT_Error)local_a0;
}

Assistant:

static SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker, SW_FT_Int side)
{
    SW_FT_Angle        total, rotate;
    SW_FT_Fixed        radius = stroker->radius;
    SW_FT_Error        error = 0;
    SW_FT_StrokeBorder border = stroker->borders + side;

    rotate = SW_FT_SIDE_TO_ROTATE(side);

    total = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == SW_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}